

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng::decompress(vector<unsigned_char,_std::allocator<unsigned_char>_> *out,uchar *in,
                        size_t insize,LodePNGDecompressSettings *settings)

{
  uint uVar1;
  uint error;
  size_t buffersize;
  uchar *buffer;
  LodePNGDecompressSettings *in_stack_ffffffffffffffa8;
  size_t in_stack_ffffffffffffffb0;
  uchar *in_stack_ffffffffffffffb8;
  size_t *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  
  uVar1 = zlib_decompress((uchar **)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                          in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                          in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  return uVar1;
}

Assistant:

unsigned decompress(std::vector<unsigned char>& out, const unsigned char* in, size_t insize,
                    const LodePNGDecompressSettings& settings) {
  unsigned char* buffer = 0;
  size_t buffersize = 0;
  unsigned error = zlib_decompress(&buffer, &buffersize, in, insize, &settings);
  if(buffer) {
    out.insert(out.end(), &buffer[0], &buffer[buffersize]);
    lodepng_free(buffer);
  }
  return error;
}